

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MeanSquaredErrorLossLayer * __thiscall
CoreML::Specification::LossLayer::mutable_meansquarederrorlosslayer(LossLayer *this)

{
  bool bVar1;
  MeanSquaredErrorLossLayer *this_00;
  LossLayer *this_local;
  
  bVar1 = has_meansquarederrorlosslayer(this);
  if (!bVar1) {
    clear_LossLayerType(this);
    set_has_meansquarederrorlosslayer(this);
    this_00 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
    MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_00);
    (this->LossLayerType_).meansquarederrorlosslayer_ = this_00;
  }
  return (MeanSquaredErrorLossLayer *)(this->LossLayerType_).categoricalcrossentropylosslayer_;
}

Assistant:

inline ::CoreML::Specification::MeanSquaredErrorLossLayer* LossLayer::mutable_meansquarederrorlosslayer() {
  if (!has_meansquarederrorlosslayer()) {
    clear_LossLayerType();
    set_has_meansquarederrorlosslayer();
    LossLayerType_.meansquarederrorlosslayer_ = new ::CoreML::Specification::MeanSquaredErrorLossLayer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LossLayer.meanSquaredErrorLossLayer)
  return LossLayerType_.meansquarederrorlosslayer_;
}